

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator
          (ImmutableExtensionLiteGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ExtensionGenerator)._vptr_ExtensionGenerator =
       (_func_int **)&PTR__ImmutableExtensionLiteGenerator_00421248;
  pcVar2 = (this->scope_)._M_dataplus._M_p;
  paVar1 = &(this->scope_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator() {}